

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForPrimary
          (CollationBuilder *this,uint32_t p,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t length;
  uint index_00;
  int32_t *rootPrimaryIndexes;
  int64_t *nodes;
  int64_t elem;
  int32_t index;
  int32_t rootIndex;
  UErrorCode *errorCode_local;
  uint32_t p_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    rootPrimaryIndexes = UVector32::getBuffer(&this->rootPrimaryIndexes);
    length = UVector32::size(&this->rootPrimaryIndexes);
    nodes = UVector64::getBuffer(&this->nodes);
    index_00 = anon_unknown_26::binarySearchForRootPrimaryNode(rootPrimaryIndexes,length,nodes,p);
    if ((int)index_00 < 0) {
      this_local._4_4_ = UVector64::size(&this->nodes);
      elem = nodeFromWeight32(p);
      UVector64::addElement(&this->nodes,elem,errorCode);
      UVector32::insertElementAt
                (&this->rootPrimaryIndexes,this_local._4_4_,index_00 ^ 0xffffffff,errorCode);
    }
    else {
      this_local._4_4_ = UVector32::elementAti(&this->rootPrimaryIndexes,index_00);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForPrimary(uint32_t p, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    int32_t rootIndex = binarySearchForRootPrimaryNode(
        rootPrimaryIndexes.getBuffer(), rootPrimaryIndexes.size(), nodes.getBuffer(), p);
    if(rootIndex >= 0) {
        return rootPrimaryIndexes.elementAti(rootIndex);
    } else {
        // Start a new list of nodes with this primary.
        int32_t index = nodes.size();
        nodes.addElement(nodeFromWeight32(p), errorCode);
        rootPrimaryIndexes.insertElementAt(index, ~rootIndex, errorCode);
        return index;
    }
}